

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_variable_elimination.h
# Opt level: O0

void __thiscall
spvtools::opt::DeadVariableElimination::DeadVariableElimination(DeadVariableElimination *this)

{
  DeadVariableElimination *this_local;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__DeadVariableElimination_010ecf48
  ;
  std::
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::unordered_map(&this->reference_count_);
  return;
}

Assistant:

const char* name() const override { return "eliminate-dead-variables"; }